

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::SmallVector<unsigned_int,_8UL>::insert
          (SmallVector<unsigned_int,_8UL> *this,uint *itr,uint *insert_begin,uint *insert_end)

{
  long lVar1;
  size_t *psVar2;
  uint uVar3;
  uint *__ptr;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  AlignedBuffer<unsigned_int,_8UL> *pAVar7;
  long lVar8;
  uint *puVar9;
  uint *puVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  AlignedBuffer<unsigned_int,_8UL> *pAVar14;
  uint *puVar15;
  size_t __n;
  
  uVar11 = (long)insert_end - (long)insert_begin >> 2;
  __ptr = (this->super_VectorView<unsigned_int>).ptr;
  sVar12 = (this->super_VectorView<unsigned_int>).buffer_size;
  puVar15 = __ptr + sVar12;
  sVar12 = sVar12 + uVar11;
  if (puVar15 == itr) {
    reserve(this,sVar12);
    if (insert_end != insert_begin) {
      sVar12 = (this->super_VectorView<unsigned_int>).buffer_size;
      puVar15 = (this->super_VectorView<unsigned_int>).ptr;
      lVar13 = 0;
      do {
        puVar15[sVar12 + lVar13] = insert_begin[lVar13];
        lVar13 = lVar13 + 1;
      } while (uVar11 + (uVar11 == 0) != lVar13);
    }
  }
  else if (this->buffer_capacity < sVar12) {
    uVar5 = 8;
    if (8 < sVar12) {
      uVar5 = sVar12;
    }
    do {
      uVar6 = uVar5;
      uVar5 = uVar6 * 2;
    } while (uVar6 < uVar11);
    if (uVar6 < 9) {
      pAVar7 = &this->stack_storage;
    }
    else {
      pAVar7 = (AlignedBuffer<unsigned_int,_8UL> *)malloc(uVar6 * 4);
    }
    if (pAVar7 == (AlignedBuffer<unsigned_int,_8UL> *)0x0) {
      ::std::terminate();
    }
    puVar9 = __ptr;
    pAVar14 = pAVar7;
    if (__ptr != itr && pAVar7 != (AlignedBuffer<unsigned_int,_8UL> *)__ptr) {
      do {
        *(uint *)pAVar14->aligned_char = *puVar9;
        puVar9 = puVar9 + 1;
        pAVar14 = (AlignedBuffer<unsigned_int,_8UL> *)(pAVar14->aligned_char + 4);
      } while (puVar9 != itr);
    }
    puVar10 = insert_begin;
    if (insert_begin != insert_end) {
      do {
        *(uint *)pAVar14->aligned_char = *puVar10;
        puVar10 = puVar10 + 1;
        pAVar14 = (AlignedBuffer<unsigned_int,_8UL> *)(pAVar14->aligned_char + 4);
      } while (puVar10 != insert_end);
    }
    if (puVar9 != puVar15 &&
        (insert_begin != insert_end || pAVar7 != (AlignedBuffer<unsigned_int,_8UL> *)__ptr)) {
      do {
        *(uint *)pAVar14->aligned_char = *puVar9;
        puVar9 = puVar9 + 1;
        pAVar14 = (AlignedBuffer<unsigned_int,_8UL> *)(pAVar14->aligned_char + 4);
      } while (puVar9 != puVar15);
    }
    if ((AlignedBuffer<unsigned_int,_8UL> *)__ptr != &this->stack_storage) {
      free(__ptr);
    }
    (this->super_VectorView<unsigned_int>).ptr = (uint *)pAVar7;
    this->buffer_capacity = uVar6;
  }
  else {
    lVar13 = ((long)insert_end - (long)insert_begin) + (long)puVar15;
    if (puVar15 != itr && insert_end != insert_begin) {
      lVar8 = 0;
      do {
        *(undefined4 *)(lVar13 + -4 + lVar8) = *(undefined4 *)(lVar8 + -4 + (long)puVar15);
        lVar1 = lVar8 + -4;
        if ((long)insert_begin + (4 - (long)insert_end) == lVar8) break;
        lVar4 = lVar8 + -4;
        lVar8 = lVar1;
      } while ((uint *)((long)puVar15 + lVar4) != itr);
      puVar15 = (uint *)((long)puVar15 + lVar1);
      lVar13 = lVar13 + lVar1;
    }
    __n = (long)puVar15 - (long)itr;
    if (__n != 0) {
      memmove((void *)(lVar13 - __n),itr,__n);
    }
    puVar15 = (this->super_VectorView<unsigned_int>).ptr +
              (this->super_VectorView<unsigned_int>).buffer_size;
    if (insert_begin != insert_end && puVar15 != itr) {
      do {
        uVar3 = *insert_begin;
        insert_begin = insert_begin + 1;
        *itr = uVar3;
        itr = itr + 1;
        if (itr == puVar15) break;
      } while (insert_begin != insert_end);
    }
    for (; insert_begin != insert_end; insert_begin = insert_begin + 1) {
      *itr = *insert_begin;
      itr = itr + 1;
    }
  }
  psVar2 = &(this->super_VectorView<unsigned_int>).buffer_size;
  *psVar2 = *psVar2 + uVar11;
  return;
}

Assistant:

void insert(T *itr, const T *insert_begin, const T *insert_end) SPIRV_CROSS_NOEXCEPT
	{
		auto count = size_t(insert_end - insert_begin);
		if (itr == this->end())
		{
			reserve(this->buffer_size + count);
			for (size_t i = 0; i < count; i++, insert_begin++)
				new (&this->ptr[this->buffer_size + i]) T(*insert_begin);
			this->buffer_size += count;
		}
		else
		{
			if (this->buffer_size + count > buffer_capacity)
			{
				auto target_capacity = this->buffer_size + count;
				if (target_capacity == 0)
					target_capacity = 1;
				if (target_capacity < N)
					target_capacity = N;

				while (target_capacity < count)
					target_capacity <<= 1u;

				// Need to allocate new buffer. Move everything to a new buffer.
				T *new_buffer =
				    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

				// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
				if (!new_buffer)
					std::terminate();

				// First, move elements from source buffer to new buffer.
				// We don't deal with types which can throw in move constructor.
				auto *target_itr = new_buffer;
				auto *original_source_itr = this->begin();

				if (new_buffer != this->ptr)
				{
					while (original_source_itr != itr)
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				// Copy-construct new elements.
				for (auto *source_itr = insert_begin; source_itr != insert_end; ++source_itr, ++target_itr)
					new (target_itr) T(*source_itr);

				// Move over the other half.
				if (new_buffer != this->ptr || insert_begin != insert_end)
				{
					while (original_source_itr != this->end())
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				if (this->ptr != stack_storage.data())
					free(this->ptr);
				this->ptr = new_buffer;
				buffer_capacity = target_capacity;
			}
			else
			{
				// Move in place, need to be a bit careful about which elements are constructed and which are not.
				// Move the end and construct the new elements.
				auto *target_itr = this->end() + count;
				auto *source_itr = this->end();
				while (target_itr != this->end() && source_itr != itr)
				{
					--target_itr;
					--source_itr;
					new (target_itr) T(std::move(*source_itr));
				}

				// For already constructed elements we can move-assign.
				std::move_backward(itr, source_itr, target_itr);

				// For the inserts which go to already constructed elements, we can do a plain copy.
				while (itr != this->end() && insert_begin != insert_end)
					*itr++ = *insert_begin++;

				// For inserts into newly allocated memory, we must copy-construct instead.
				while (insert_begin != insert_end)
				{
					new (itr) T(*insert_begin);
					++itr;
					++insert_begin;
				}
			}

			this->buffer_size += count;
		}
	}